

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_stdout_to_file(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  uv_timer_t *puVar8;
  int extraout_EDX;
  char *pcVar9;
  char *pcVar10;
  ulong unaff_RBP;
  uv_process_t *puVar11;
  uv_timer_t *puVar12;
  code *pcVar13;
  uv_process_options_t *unaff_R14;
  undefined8 unaff_R15;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uv_stdio_container_t stdio [2];
  uv_fs_t fs_req;
  int iStack_e6c;
  undefined1 auStack_e68 [16];
  uv_stdio_container_t uStack_e58;
  undefined4 uStack_e48;
  undefined4 uStack_e40;
  undefined4 uStack_e38;
  undefined4 uStack_e30;
  undefined4 uStack_e28;
  int iStack_e20;
  code *pcStack_e18;
  undefined1 auStack_e10 [240];
  code *pcStack_d20;
  uv_stdio_container_t uStack_d18;
  undefined4 uStack_d08;
  undefined4 uStack_cf8;
  undefined4 uStack_ce8;
  undefined1 *puStack_ce0;
  undefined1 auStack_cd0 [264];
  undefined1 *puStack_bc8;
  anon_union_8_2_26168aa3_for_data aStack_bc0;
  code *pcStack_bb8;
  code *pcStack_bb0;
  char acStack_ba8 [32];
  undefined1 *puStack_b88;
  undefined8 uStack_b80;
  uv_stdio_container_t uStack_b78;
  undefined4 uStack_b68;
  undefined1 *puStack_b60;
  undefined1 auStack_b58 [264];
  undefined1 auStack_a50 [264];
  undefined1 auStack_948 [192];
  char *pcStack_888;
  uv_process_options_t *puStack_880;
  code *pcStack_878;
  undefined8 uStack_870;
  undefined1 auStack_868 [16];
  uv_process_options_t auStack_858 [6];
  uv_stdio_container_t uStack_6a0;
  undefined4 uStack_690;
  uint uStack_688;
  undefined4 uStack_680;
  uint uStack_678;
  char *pcStack_668;
  uv_process_options_t *puStack_660;
  undefined1 auStack_638 [16];
  uv_stdio_container_t uStack_628;
  undefined4 uStack_618;
  uint uStack_610;
  undefined4 uStack_608;
  uint uStack_600;
  uv_process_options_t auStack_5f0 [6];
  char *pcStack_438;
  uv_process_options_t *puStack_430;
  undefined1 auStack_410 [16];
  uv_stdio_container_t uStack_400;
  undefined4 uStack_3f0;
  uint uStack_3e8;
  undefined4 uStack_3e0;
  uint uStack_3d8;
  uv_process_options_t auStack_3d0 [6];
  char *pcStack_218;
  uv_process_options_t *puStack_210;
  undefined8 local_208;
  undefined1 local_1f8 [16];
  uv_stdio_container_t local_1e8;
  undefined4 local_1d8;
  uint local_1d0;
  uv_process_options_t local_1c8 [6];
  
  pcVar9 = "stdout_file";
  puStack_210 = (uv_process_options_t *)0x17979b;
  unlink("stdout_file");
  puStack_210 = (uv_process_options_t *)0x1797ae;
  init_process_options("spawn_helper2",exit_cb);
  puStack_210 = (uv_process_options_t *)0x1797cb;
  uVar1 = uv_fs_open(0,local_1c8,"stdout_file",0x42,0x180,0);
  if (uVar1 == 0xffffffff) {
    puStack_210 = (uv_process_options_t *)0x17995f;
    run_test_spawn_stdout_to_file_cold_9();
LAB_0017995f:
    puStack_210 = (uv_process_options_t *)0x179964;
    run_test_spawn_stdout_to_file_cold_1();
LAB_00179964:
    puStack_210 = (uv_process_options_t *)0x179969;
    run_test_spawn_stdout_to_file_cold_2();
LAB_00179969:
    puStack_210 = (uv_process_options_t *)0x17996e;
    run_test_spawn_stdout_to_file_cold_3();
LAB_0017996e:
    puStack_210 = (uv_process_options_t *)0x179973;
    run_test_spawn_stdout_to_file_cold_4();
LAB_00179973:
    puStack_210 = (uv_process_options_t *)0x179978;
    run_test_spawn_stdout_to_file_cold_5();
LAB_00179978:
    puStack_210 = (uv_process_options_t *)0x17997d;
    run_test_spawn_stdout_to_file_cold_6();
LAB_0017997d:
    puStack_210 = (uv_process_options_t *)0x179982;
    run_test_spawn_stdout_to_file_cold_7();
  }
  else {
    pcVar9 = (char *)(ulong)uVar1;
    puStack_210 = (uv_process_options_t *)0x1797e0;
    uv_fs_req_cleanup(local_1c8);
    options.stdio = &local_1e8;
    unaff_R14 = &options;
    local_1e8.flags = UV_IGNORE;
    local_1d8 = 2;
    options.stdio_count = 2;
    puStack_210 = (uv_process_options_t *)0x17980f;
    local_1d0 = uVar1;
    uVar5 = uv_default_loop();
    puStack_210 = (uv_process_options_t *)0x179821;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_0017995f;
    puStack_210 = (uv_process_options_t *)0x17982e;
    uVar5 = uv_default_loop();
    puStack_210 = (uv_process_options_t *)0x179838;
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_00179964;
    if (exit_cb_called != 1) goto LAB_00179969;
    if (close_cb_called != 1) goto LAB_0017996e;
    puStack_210 = (uv_process_options_t *)0x17986b;
    local_1f8 = uv_buf_init(output,0x400);
    local_208 = 0;
    puStack_210 = (uv_process_options_t *)0x179896;
    iVar2 = uv_fs_read(0,local_1c8,uVar1,local_1f8,1,0);
    if (iVar2 != 0xc) goto LAB_00179973;
    unaff_R14 = local_1c8;
    puStack_210 = (uv_process_options_t *)0x1798ac;
    uv_fs_req_cleanup(unaff_R14);
    puStack_210 = (uv_process_options_t *)0x1798ba;
    iVar2 = uv_fs_close(0,unaff_R14,pcVar9,0);
    if (iVar2 != 0) goto LAB_00179978;
    puStack_210 = (uv_process_options_t *)0x1798cc;
    uv_fs_req_cleanup(local_1c8);
    puStack_210 = (uv_process_options_t *)0x1798e1;
    printf("output is: %s",output);
    if (CONCAT17(output[0xc],
                 CONCAT16(output[0xb],
                          CONCAT15(output[10],
                                   CONCAT14(output[9],
                                            CONCAT13(output[8],
                                                     CONCAT12(output[7],
                                                              CONCAT11(output[6],output[5]))))))) !=
        0xa646c726f7720 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x6f77206f6c6c6568) goto LAB_0017997d;
    puStack_210 = (uv_process_options_t *)0x179914;
    unlink("stdout_file");
    puStack_210 = (uv_process_options_t *)0x179919;
    pcVar9 = (char *)uv_default_loop();
    puStack_210 = (uv_process_options_t *)0x17992d;
    uv_walk(pcVar9,close_walk_cb,0);
    puStack_210 = (uv_process_options_t *)0x179937;
    uv_run(pcVar9,0);
    puStack_210 = (uv_process_options_t *)0x17993c;
    uVar5 = uv_default_loop();
    puStack_210 = (uv_process_options_t *)0x179944;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      puStack_210 = (uv_process_options_t *)0x17994d;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_210 = (uv_process_options_t *)run_test_spawn_stdout_and_stderr_to_file;
  run_test_spawn_stdout_to_file_cold_8();
  pcVar10 = "stdout_file";
  pcStack_218 = pcVar9;
  puStack_210 = unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  uVar1 = uv_fs_open(0,auStack_3d0,"stdout_file",0x42,0x180,0);
  if (uVar1 == 0xffffffff) {
    run_test_spawn_stdout_and_stderr_to_file_cold_9();
LAB_00179b76:
    run_test_spawn_stdout_and_stderr_to_file_cold_1();
LAB_00179b7b:
    run_test_spawn_stdout_and_stderr_to_file_cold_2();
LAB_00179b80:
    run_test_spawn_stdout_and_stderr_to_file_cold_3();
LAB_00179b85:
    run_test_spawn_stdout_and_stderr_to_file_cold_4();
LAB_00179b8a:
    run_test_spawn_stdout_and_stderr_to_file_cold_5();
LAB_00179b8f:
    run_test_spawn_stdout_and_stderr_to_file_cold_6();
LAB_00179b94:
    run_test_spawn_stdout_and_stderr_to_file_cold_7();
  }
  else {
    pcVar10 = (char *)(ulong)uVar1;
    uv_fs_req_cleanup(auStack_3d0);
    options.stdio = &uStack_400;
    unaff_R14 = &options;
    uStack_400.flags = UV_IGNORE;
    uStack_3f0 = 2;
    uStack_3e0 = 2;
    options.stdio_count = 3;
    uStack_3e8 = uVar1;
    uStack_3d8 = uVar1;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_00179b76;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_00179b7b;
    if (exit_cb_called != 1) goto LAB_00179b80;
    if (close_cb_called != 1) goto LAB_00179b85;
    auStack_410 = uv_buf_init(output,0x400);
    iVar2 = uv_fs_read(0,auStack_3d0,pcVar10,auStack_410,1,0);
    if (iVar2 != 0x1b) goto LAB_00179b8a;
    unaff_R14 = auStack_3d0;
    uv_fs_req_cleanup(unaff_R14);
    iVar2 = uv_fs_close(0,unaff_R14,uVar1,0);
    if (iVar2 != 0) goto LAB_00179b8f;
    uv_fs_req_cleanup(auStack_3d0);
    printf("output is: %s",output);
    auVar16[0] = -(output[0xc] == 'h');
    auVar16[1] = -(output[0xd] == 'e');
    auVar16[2] = -(output[0xe] == 'l');
    auVar16[3] = -(output[0xf] == 'l');
    auVar16[4] = -(output[0x10] == 'o');
    auVar16[5] = -(output[0x11] == ' ');
    auVar16[6] = -(output[0x12] == 'e');
    auVar16[7] = -(output[0x13] == 'r');
    auVar16[8] = -(output[0x14] == 'r');
    auVar16[9] = -(output[0x15] == 'w');
    auVar16[10] = -(output[0x16] == 'o');
    auVar16[0xb] = -(output[0x17] == 'r');
    auVar16[0xc] = -(output[0x18] == 'l');
    auVar16[0xd] = -(output[0x19] == 'd');
    auVar16[0xe] = -(output[0x1a] == '\n');
    auVar16[0xf] = -(output[0x1b] == '\0');
    auVar14[0] = -(output[0] == 'h');
    auVar14[1] = -(output[1] == 'e');
    auVar14[2] = -(output[2] == 'l');
    auVar14[3] = -(output[3] == 'l');
    auVar14[4] = -(output[4] == 'o');
    auVar14[5] = -(output[5] == ' ');
    auVar14[6] = -(output[6] == 'w');
    auVar14[7] = -(output[7] == 'o');
    auVar14[8] = -(output[8] == 'r');
    auVar14[9] = -(output[9] == 'l');
    auVar14[10] = -(output[10] == 'd');
    auVar14[0xb] = -(output[0xb] == '\n');
    auVar14[0xc] = -(output[0xc] == 'h');
    auVar14[0xd] = -(output[0xd] == 'e');
    auVar14[0xe] = -(output[0xe] == 'l');
    auVar14[0xf] = -(output[0xf] == 'l');
    auVar14 = auVar14 & auVar16;
    if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00179b94;
    unlink("stdout_file");
    pcVar10 = (char *)uv_default_loop();
    uv_walk(pcVar10,close_walk_cb,0);
    uv_run(pcVar10,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  run_test_spawn_stdout_and_stderr_to_file_cold_8();
  pcVar9 = "stdout_file";
  pcStack_438 = pcVar10;
  puStack_430 = unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  uVar1 = uv_fs_open(0,auStack_5f0,"stdout_file",0x42,0x180,0);
  if (uVar1 == 0xffffffff) {
    run_test_spawn_stdout_and_stderr_to_file2_cold_10();
LAB_00179da6:
    run_test_spawn_stdout_and_stderr_to_file2_cold_9();
LAB_00179dab:
    run_test_spawn_stdout_and_stderr_to_file2_cold_1();
LAB_00179db0:
    run_test_spawn_stdout_and_stderr_to_file2_cold_2();
LAB_00179db5:
    run_test_spawn_stdout_and_stderr_to_file2_cold_3();
LAB_00179dba:
    run_test_spawn_stdout_and_stderr_to_file2_cold_4();
LAB_00179dbf:
    run_test_spawn_stdout_and_stderr_to_file2_cold_5();
LAB_00179dc4:
    run_test_spawn_stdout_and_stderr_to_file2_cold_6();
LAB_00179dc9:
    run_test_spawn_stdout_and_stderr_to_file2_cold_7();
  }
  else {
    pcVar9 = (char *)(ulong)uVar1;
    uv_fs_req_cleanup(auStack_5f0);
    unaff_RBP = 2;
    uVar1 = dup2(uVar1,2);
    if (uVar1 == 0xffffffff) goto LAB_00179da6;
    pcVar9 = (char *)(ulong)uVar1;
    options.stdio = &uStack_628;
    unaff_R14 = &options;
    uStack_628.flags = UV_IGNORE;
    uStack_618 = 2;
    uStack_608 = 2;
    options.stdio_count = 3;
    uStack_610 = uVar1;
    uStack_600 = uVar1;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_00179dab;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_00179db0;
    if (exit_cb_called != 1) goto LAB_00179db5;
    if (close_cb_called != 1) goto LAB_00179dba;
    auStack_638 = uv_buf_init(output,0x400);
    iVar2 = uv_fs_read(0,auStack_5f0,pcVar9,auStack_638,1,0);
    if (iVar2 != 0x1b) goto LAB_00179dbf;
    unaff_R14 = auStack_5f0;
    uv_fs_req_cleanup(unaff_R14);
    iVar2 = uv_fs_close(0,unaff_R14,uVar1,0);
    if (iVar2 != 0) goto LAB_00179dc4;
    uv_fs_req_cleanup(auStack_5f0);
    printf("output is: %s",output);
    auVar17[0] = -(output[0xc] == 'h');
    auVar17[1] = -(output[0xd] == 'e');
    auVar17[2] = -(output[0xe] == 'l');
    auVar17[3] = -(output[0xf] == 'l');
    auVar17[4] = -(output[0x10] == 'o');
    auVar17[5] = -(output[0x11] == ' ');
    auVar17[6] = -(output[0x12] == 'e');
    auVar17[7] = -(output[0x13] == 'r');
    auVar17[8] = -(output[0x14] == 'r');
    auVar17[9] = -(output[0x15] == 'w');
    auVar17[10] = -(output[0x16] == 'o');
    auVar17[0xb] = -(output[0x17] == 'r');
    auVar17[0xc] = -(output[0x18] == 'l');
    auVar17[0xd] = -(output[0x19] == 'd');
    auVar17[0xe] = -(output[0x1a] == '\n');
    auVar17[0xf] = -(output[0x1b] == '\0');
    auVar15[0] = -(output[0] == 'h');
    auVar15[1] = -(output[1] == 'e');
    auVar15[2] = -(output[2] == 'l');
    auVar15[3] = -(output[3] == 'l');
    auVar15[4] = -(output[4] == 'o');
    auVar15[5] = -(output[5] == ' ');
    auVar15[6] = -(output[6] == 'w');
    auVar15[7] = -(output[7] == 'o');
    auVar15[8] = -(output[8] == 'r');
    auVar15[9] = -(output[9] == 'l');
    auVar15[10] = -(output[10] == 'd');
    auVar15[0xb] = -(output[0xb] == '\n');
    auVar15[0xc] = -(output[0xc] == 'h');
    auVar15[0xd] = -(output[0xd] == 'e');
    auVar15[0xe] = -(output[0xe] == 'l');
    auVar15[0xf] = -(output[0xf] == 'l');
    auVar15 = auVar15 & auVar17;
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00179dc9;
    unlink("stdout_file");
    pcVar9 = (char *)uv_default_loop();
    uv_walk(pcVar9,close_walk_cb,0);
    uv_run(pcVar9,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  run_test_spawn_stdout_and_stderr_to_file2_cold_8();
  pcVar10 = "stdout_file";
  pcStack_878 = (code *)0x179def;
  pcStack_668 = pcVar9;
  puStack_660 = unaff_R14;
  unlink("stdout_file");
  pcStack_878 = (code *)0x179dfb;
  unlink("stderr_file");
  pcStack_878 = (code *)0x179e0e;
  init_process_options("spawn_helper6",exit_cb);
  pcStack_878 = (code *)0x179e2b;
  uVar1 = uv_fs_open(0,auStack_858,"stdout_file",0x42,0x180,0);
  if (uVar1 == 0xffffffff) {
    pcStack_878 = (code *)0x17a0dc;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_0017a0dc:
    pcStack_878 = (code *)0x17a0e1;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_0017a0e1:
    pcStack_878 = (code *)0x17a0e6;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_0017a0e6:
    pcStack_878 = (code *)0x17a0eb;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_0017a0eb:
    pcStack_878 = (code *)0x17a0f0;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_0017a0f0:
    pcStack_878 = (code *)0x17a0f5;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_0017a0f5:
    pcStack_878 = (code *)0x17a0fa;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_0017a0fa:
    pcStack_878 = (code *)0x17a0ff;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_0017a0ff:
    pcStack_878 = (code *)0x17a104;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_0017a104:
    pcStack_878 = (code *)0x17a109;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
LAB_0017a109:
    pcStack_878 = (code *)0x17a10e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_0017a10e:
    pcStack_878 = (code *)0x17a113;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_0017a113:
    pcStack_878 = (code *)0x17a118;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_0017a118:
    pcStack_878 = (code *)0x17a11d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  else {
    pcVar10 = (char *)(ulong)uVar1;
    pcStack_878 = (code *)0x179e40;
    uv_fs_req_cleanup(auStack_858);
    pcStack_878 = (code *)0x179e4c;
    uVar1 = dup2(uVar1,1);
    if (uVar1 == 0xffffffff) goto LAB_0017a0dc;
    unaff_RBP = (ulong)uVar1;
    pcStack_878 = (code *)0x179e78;
    uVar3 = uv_fs_open(0,auStack_858,"stderr_file",0x42,0x180,0);
    if (uVar3 == 0xffffffff) goto LAB_0017a0e1;
    pcVar10 = (char *)(ulong)uVar3;
    pcStack_878 = (code *)0x179e8d;
    uv_fs_req_cleanup(auStack_858);
    unaff_R15 = 2;
    pcStack_878 = (code *)0x179e9f;
    uVar3 = dup2(uVar3,2);
    if (uVar3 == 0xffffffff) goto LAB_0017a0e6;
    pcVar10 = (char *)(ulong)uVar3;
    options.stdio = &uStack_6a0;
    unaff_R14 = &options;
    uStack_6a0.flags = UV_IGNORE;
    uStack_690 = 2;
    uStack_680 = 2;
    options.stdio_count = 3;
    pcStack_878 = (code *)0x179ee3;
    uStack_688 = uVar3;
    uStack_678 = uVar1;
    uVar5 = uv_default_loop();
    pcStack_878 = (code *)0x179ef5;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_0017a0eb;
    pcStack_878 = (code *)0x179f02;
    uVar5 = uv_default_loop();
    pcStack_878 = (code *)0x179f0c;
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0017a0f0;
    if (exit_cb_called != 1) goto LAB_0017a0f5;
    if (close_cb_called != 1) goto LAB_0017a0fa;
    pcStack_878 = (code *)0x179f3f;
    auStack_868 = uv_buf_init(output,0x400);
    uStack_870 = 0;
    pcStack_878 = (code *)0x179f6a;
    iVar2 = uv_fs_read(0,auStack_858,uVar1,auStack_868,1,0);
    if (iVar2 < 0xf) goto LAB_0017a0ff;
    unaff_R14 = auStack_858;
    pcStack_878 = (code *)0x179f80;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_878 = (code *)0x179f8e;
    iVar2 = uv_fs_close(0,unaff_R14,unaff_RBP,0);
    if (iVar2 != 0) goto LAB_0017a104;
    pcStack_878 = (code *)0x179fa0;
    uv_fs_req_cleanup(auStack_858);
    pcStack_878 = (code *)0x179fb5;
    printf("output is: %s",output);
    if (CONCAT17(output[0xe],
                 CONCAT16(output[0xd],
                          CONCAT15(output[0xc],
                                   CONCAT14(output[0xb],
                                            CONCAT13(output[10],
                                                     CONCAT12(output[9],
                                                              CONCAT11(output[8],output[7]))))))) !=
        0xa646c726f777272 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x7265206f6c6c6568) goto LAB_0017a109;
    uStack_870 = 0;
    pcStack_878 = (code *)0x17a004;
    iVar2 = uv_fs_read(0,auStack_858,uVar3,auStack_868,1,0);
    if (iVar2 < 0xc) goto LAB_0017a10e;
    unaff_R14 = auStack_858;
    pcStack_878 = (code *)0x17a01a;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_878 = (code *)0x17a028;
    iVar2 = uv_fs_close(0,unaff_R14,pcVar10,0);
    if (iVar2 != 0) goto LAB_0017a113;
    pcStack_878 = (code *)0x17a03a;
    uv_fs_req_cleanup(auStack_858);
    pcStack_878 = (code *)0x17a04f;
    printf("output is: %s",output);
    if (CONCAT13(output[0xb],CONCAT12(output[10],CONCAT11(output[9],output[8]))) != 0xa646c72 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x6f77206f6c6c6568) goto LAB_0017a118;
    pcStack_878 = (code *)0x17a082;
    unlink("stdout_file");
    pcStack_878 = (code *)0x17a08e;
    unlink("stderr_file");
    pcStack_878 = (code *)0x17a093;
    pcVar10 = (char *)uv_default_loop();
    pcStack_878 = (code *)0x17a0a7;
    uv_walk(pcVar10,close_walk_cb,0);
    pcStack_878 = (code *)0x17a0b1;
    uv_run(pcVar10,0);
    pcStack_878 = (code *)0x17a0b6;
    uVar5 = uv_default_loop();
    pcStack_878 = (code *)0x17a0be;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      pcStack_878 = (code *)0x17a0c7;
      uv_library_shutdown();
      return 0;
    }
  }
  pcStack_878 = run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  pcVar9 = acStack_ba8;
  builtin_strncpy(acStack_ba8,"hello-from-spawn_stdin",0x17);
  pcStack_bb0 = (code *)0x17a15b;
  pcStack_888 = pcVar10;
  puStack_880 = unaff_R14;
  pcStack_878 = (code *)unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  pcStack_bb0 = (code *)0x17a160;
  uVar5 = uv_default_loop();
  puVar7 = auStack_a50;
  pcStack_bb0 = (code *)0x17a175;
  uv_pipe_init(uVar5,puVar7,0);
  pcStack_bb0 = (code *)0x17a17a;
  uVar5 = uv_default_loop();
  pcStack_bb0 = (code *)0x17a18c;
  uv_pipe_init(uVar5,(uv_stream_t *)auStack_b58,0);
  options.stdio = &uStack_b78;
  uStack_b78.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  uStack_b68 = 0x21;
  options.stdio_count = 2;
  pcStack_bb0 = (code *)0x17a1c3;
  uStack_b78.data.stream = (uv_stream_t *)auStack_b58;
  puStack_b60 = puVar7;
  puVar6 = (undefined1 *)uv_default_loop();
  iVar2 = 0x331810;
  pcStack_bb0 = (code *)0x17a1d5;
  iVar4 = uv_spawn(puVar6,&process,&options);
  if (iVar4 == 0) {
    uStack_b80 = 0x17;
    puVar6 = auStack_948;
    iVar2 = (int)auStack_b58;
    pcStack_bb0 = (code *)0x17a20e;
    puStack_b88 = acStack_ba8;
    iVar4 = uv_write();
    if (iVar4 != 0) goto LAB_0017a2be;
    iVar2 = 0x179737;
    puVar6 = auStack_a50;
    pcStack_bb0 = (code *)0x17a231;
    iVar4 = uv_read_start(puVar6,on_alloc,on_read);
    if (iVar4 != 0) goto LAB_0017a2c3;
    pcStack_bb0 = (code *)0x17a23e;
    puVar6 = (undefined1 *)uv_default_loop();
    iVar2 = 0;
    pcStack_bb0 = (code *)0x17a248;
    iVar4 = uv_run();
    if (iVar4 != 0) goto LAB_0017a2c8;
    if (exit_cb_called != 1) goto LAB_0017a2cd;
    if (close_cb_called != 3) goto LAB_0017a2d2;
    iVar2 = 0x3318a0;
    pcStack_bb0 = (code *)0x17a26d;
    iVar4 = strcmp(acStack_ba8,output);
    if (iVar4 != 0) goto LAB_0017a2d7;
    pcStack_bb0 = (code *)0x17a276;
    puVar7 = (undefined1 *)uv_default_loop();
    pcStack_bb0 = (code *)0x17a28a;
    uv_walk(puVar7,close_walk_cb,0);
    iVar2 = 0;
    pcStack_bb0 = (code *)0x17a294;
    uv_run(puVar7);
    pcStack_bb0 = (code *)0x17a299;
    pcVar9 = (char *)uv_default_loop();
    pcStack_bb0 = (code *)0x17a2a1;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      pcStack_bb0 = (code *)0x17a2aa;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_bb0 = (code *)0x17a2be;
    run_test_spawn_stdin_cold_1();
LAB_0017a2be:
    pcStack_bb0 = (code *)0x17a2c3;
    run_test_spawn_stdin_cold_2();
LAB_0017a2c3:
    pcStack_bb0 = (code *)0x17a2c8;
    run_test_spawn_stdin_cold_3();
LAB_0017a2c8:
    pcStack_bb0 = (code *)0x17a2cd;
    run_test_spawn_stdin_cold_4();
LAB_0017a2cd:
    pcStack_bb0 = (code *)0x17a2d2;
    run_test_spawn_stdin_cold_5();
LAB_0017a2d2:
    pcVar9 = puVar6;
    pcStack_bb0 = (code *)0x17a2d7;
    run_test_spawn_stdin_cold_6();
LAB_0017a2d7:
    pcStack_bb0 = (code *)0x17a2dc;
    run_test_spawn_stdin_cold_7();
  }
  pcStack_bb0 = write_cb;
  run_test_spawn_stdin_cold_8();
  if (iVar2 == 0) {
    iVar2 = uv_close(*(undefined8 *)(pcVar9 + 0x50),close_cb);
    return iVar2;
  }
  pcStack_bb8 = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  pcStack_d20 = (code *)0x17a319;
  puStack_bc8 = puVar7;
  aStack_bc0.stream = (uv_stream_t *)auStack_b58;
  pcStack_bb8 = (code *)unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  pcStack_d20 = (code *)0x17a31e;
  uVar5 = uv_default_loop();
  puVar7 = auStack_cd0;
  pcStack_d20 = (code *)0x17a332;
  uv_pipe_init(uVar5,puVar7,0);
  uStack_d18.flags = UV_IGNORE;
  uStack_d08 = 0;
  uStack_cf8 = 0;
  uStack_ce8 = 0x21;
  options.stdio_count = 4;
  pcStack_d20 = (code *)0x17a365;
  options.stdio = &uStack_d18;
  puStack_ce0 = puVar7;
  uVar5 = uv_default_loop();
  pcStack_d20 = (code *)0x17a377;
  iVar2 = uv_spawn(uVar5,&process,&options);
  if (iVar2 == 0) {
    pcStack_d20 = (code *)0x17a397;
    iVar2 = uv_read_start(auStack_cd0,on_alloc,on_read);
    if (iVar2 != 0) goto LAB_0017a458;
    pcStack_d20 = (code *)0x17a3a4;
    uVar5 = uv_default_loop();
    pcStack_d20 = (code *)0x17a3ae;
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0017a45d;
    if (exit_cb_called != 1) goto LAB_0017a462;
    if (close_cb_called != 2) goto LAB_0017a467;
    pcStack_d20 = (code *)0x17a3e5;
    printf("output from stdio[3] is: %s",output);
    if (CONCAT17(output[0xe],
                 CONCAT16(output[0xd],
                          CONCAT15(output[0xc],
                                   CONCAT14(output[0xb],
                                            CONCAT13(output[10],
                                                     CONCAT12(output[9],
                                                              CONCAT11(output[8],output[7]))))))) !=
        0xa216f69647473 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x7320687472756f66) goto LAB_0017a46c;
    pcStack_d20 = (code *)0x17a411;
    puVar7 = (undefined1 *)uv_default_loop();
    pcStack_d20 = (code *)0x17a425;
    uv_walk(puVar7,close_walk_cb,0);
    pcStack_d20 = (code *)0x17a42f;
    uv_run(puVar7,0);
    pcStack_d20 = (code *)0x17a434;
    uVar5 = uv_default_loop();
    pcStack_d20 = (code *)0x17a43c;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      pcStack_d20 = (code *)0x17a445;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_d20 = (code *)0x17a458;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_0017a458:
    pcStack_d20 = (code *)0x17a45d;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_0017a45d:
    pcStack_d20 = (code *)0x17a462;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_0017a462:
    pcStack_d20 = (code *)0x17a467;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_0017a467:
    pcStack_d20 = (code *)0x17a46c;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_0017a46c:
    pcStack_d20 = (code *)0x17a471;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  pcStack_d20 = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  pcStack_e18 = (code *)0x17a482;
  uVar5 = uv_default_loop();
  pcStack_e18 = (code *)0x17a48d;
  iVar2 = uv_tcp_init(uVar5,auStack_e10);
  if (iVar2 == 0) {
    pcStack_e18 = (code *)0x17a49e;
    iVar2 = uv_tcp_open(auStack_e10,3);
    if (iVar2 != 0) goto LAB_0017a4c7;
    pcStack_e18 = (code *)0x17a4b1;
    iVar2 = uv_listen(auStack_e10,0x1000,0);
    if (iVar2 == 0) {
      return 1;
    }
  }
  else {
    pcStack_e18 = (code *)0x17a4c7;
    spawn_tcp_server_helper_cold_1();
LAB_0017a4c7:
    pcStack_e18 = (code *)0x17a4cc;
    spawn_tcp_server_helper_cold_2();
  }
  pcStack_e18 = run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  pcStack_e18 = (code *)puVar7;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_e68);
  if (iVar2 == 0) {
    iStack_e6c = -1;
    uVar5 = uv_default_loop();
    iVar2 = uv_tcp_init_ex(uVar5,&tcp_server,2);
    if (iVar2 != 0) goto LAB_0017a637;
    iVar2 = uv_tcp_bind(&tcp_server,auStack_e68,0);
    if (iVar2 != 0) goto LAB_0017a63c;
    iVar2 = uv_fileno(&tcp_server,&iStack_e6c);
    if (iVar2 != 0) goto LAB_0017a641;
    if (iStack_e6c < 1) goto LAB_0017a646;
    options.stdio = &uStack_e58;
    uStack_e58.flags = UV_INHERIT_FD;
    uStack_e58.data.fd = 0;
    uStack_e48 = 2;
    uStack_e40 = 1;
    uStack_e38 = 2;
    uStack_e30 = 2;
    uStack_e28 = 2;
    iStack_e20 = iStack_e6c;
    options.stdio_count = 4;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_0017a64b;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0017a650;
    if (exit_cb_called != 1) goto LAB_0017a655;
    if (close_cb_called != 1) goto LAB_0017a65a;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_0017a637:
    run_test_spawn_tcp_server_cold_2();
LAB_0017a63c:
    run_test_spawn_tcp_server_cold_3();
LAB_0017a641:
    run_test_spawn_tcp_server_cold_4();
LAB_0017a646:
    run_test_spawn_tcp_server_cold_5();
LAB_0017a64b:
    run_test_spawn_tcp_server_cold_6();
LAB_0017a650:
    run_test_spawn_tcp_server_cold_7();
LAB_0017a655:
    run_test_spawn_tcp_server_cold_8();
LAB_0017a65a:
    run_test_spawn_tcp_server_cold_9();
  }
  run_test_spawn_tcp_server_cold_10();
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  uVar5 = uv_default_loop();
  iVar2 = uv_spawn(uVar5,&process,&options);
  if (iVar2 == 0) {
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0017a716;
    if (exit_cb_called != 1) goto LAB_0017a71b;
    if (close_cb_called != 1) goto LAB_0017a720;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_0017a716:
    run_test_spawn_ignored_stdio_cold_2();
LAB_0017a71b:
    run_test_spawn_ignored_stdio_cold_3();
LAB_0017a720:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  puVar8 = (uv_timer_t *)uv_default_loop();
  puVar11 = &process;
  iVar2 = uv_spawn(puVar8,&process,&options);
  if (iVar2 == 0) {
    puVar8 = (uv_timer_t *)uv_default_loop();
    puVar12 = &timer;
    iVar2 = uv_timer_init();
    pcVar13 = (code *)puVar12;
    if (iVar2 != 0) goto LAB_0017a802;
    puVar8 = &timer;
    pcVar13 = timer_cb;
    iVar2 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar2 != 0) goto LAB_0017a807;
    puVar8 = (uv_timer_t *)uv_default_loop();
    pcVar13 = (code *)0x0;
    iVar2 = uv_run();
    if (iVar2 != 0) goto LAB_0017a80c;
    if (exit_cb_called != 1) goto LAB_0017a811;
    if (close_cb_called != 2) goto LAB_0017a816;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    pcVar13 = (code *)0x0;
    uv_run(uVar5);
    puVar8 = (uv_timer_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar13 = (code *)puVar11;
LAB_0017a802:
    run_test_spawn_and_kill_cold_2();
LAB_0017a807:
    run_test_spawn_and_kill_cold_3();
LAB_0017a80c:
    run_test_spawn_and_kill_cold_4();
LAB_0017a811:
    run_test_spawn_and_kill_cold_5();
LAB_0017a816:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  pcVar9 = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar13 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close(puVar8,close_cb);
      pcVar9 = (char *)(ulong)*(uint *)puVar8->heap_node;
      iVar2 = uv_kill(pcVar9,0);
      if (iVar2 == -3) {
        return iVar2;
      }
      goto LAB_0017a875;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_0017a875:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  iVar2 = uv_close(pcVar9,close_cb);
  return iVar2;
}

Assistant:

TEST_IMPL(spawn_stdout_to_file) {
  int r;
  uv_file file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[2];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper2", exit_cb);

  r = uv_fs_open(NULL, &fs_req, "stdout_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);

  file = r;

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = file;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT(r == 12);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strcmp("hello world\n", output) == 0);

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}